

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O3

void __thiscall
biosoup::test::BiosoupTimerTest_Start_Test::TestBody(BiosoupTimerTest_Start_Test *this)

{
  double dVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  char *in_R9;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  undefined8 *local_38;
  string local_30;
  
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_30._M_dataplus._M_p = (char *)0x0;
  local_30._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar3 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
    if (iVar3 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  if (lVar4 == 0) {
    local_40[0] = (internal)0x0;
  }
  else {
    lVar6 = std::chrono::_V2::steady_clock::now();
    dVar1 = (double)(lVar6 - lVar4) / 1000000000.0;
    local_40[0] = (internal)(dVar1 <= 0.384 && 0.256 <= dVar1);
    local_38 = (undefined8 *)0x0;
    if ((bool)local_40[0]) goto LAB_00114484;
  }
  local_38 = (undefined8 *)0x0;
  testing::Message::Message((Message *)&local_48);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_30,local_40,(AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.Stop())",
             "false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
             ,0x14,local_30._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  puVar2 = local_38;
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(puVar2);
  }
LAB_00114484:
  std::chrono::_V2::steady_clock::now();
  local_30._M_dataplus._M_p = (char *)0x0;
  local_30._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar3 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
    if (iVar3 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  lVar4 = std::chrono::_V2::steady_clock::now();
  if (lVar4 == 0) {
    dVar1 = 0.0;
  }
  else {
    lVar6 = std::chrono::_V2::steady_clock::now();
    dVar1 = (double)(lVar6 - lVar4) / 1000000000.0;
  }
  local_40[0] = (internal)(dVar1 <= 0.001 && 0.0 <= dVar1);
  local_38 = (undefined8 *)0x0;
  if (dVar1 > 0.001 || 0.0 > dVar1) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"ExpectWithinInclusive(0, 0.001, t.Stop())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x18,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    puVar2 = local_38;
    if (local_38 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_38 != local_38 + 2) {
        operator_delete((undefined8 *)*local_38);
      }
      operator_delete(puVar2);
    }
  }
  return;
}

Assistant:

TEST(BiosoupTimerTest, Stop) {
  Timer t{};
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_EQ(0, t.elapsed_time());
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Stop();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.512, 0.768, t.elapsed_time()));
}